

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  art_ref_t aVar1;
  art_val_t *paVar2;
  art_t *paVar3;
  uint8_t type2;
  ulong uVar4;
  container_t *pcVar5;
  leaf_t val;
  container_t *pcVar6;
  uint uVar7;
  uint uVar8;
  uint8_t type1;
  uint uVar9;
  undefined8 *c;
  art_iterator_t *iterator;
  ulong *puVar10;
  leaf_t *leaf1;
  bool bVar11;
  bool bVar12;
  uint8_t typecode2;
  art_iterator_t it1;
  art_iterator_t it2;
  uint8_t local_151;
  art_iterator_t local_150;
  art_iterator_t local_c0;
  
  if (r1 != r2) {
    memset(&local_150,0,0x90);
    aVar1 = (r1->art).root;
    local_150.art = &r1->art;
    if (aVar1 != 0) {
      art_node_init_iterator(aVar1,&local_150,true);
    }
    memset(&local_c0,0,0x90);
    aVar1 = (r2->art).root;
    puVar10 = (ulong *)0x0;
    local_c0.art = &r2->art;
    if (aVar1 != 0) {
      art_node_init_iterator(aVar1,&local_c0,true);
      puVar10 = local_c0.value;
    }
    bVar11 = local_150.value != (ulong *)0x0;
    bVar12 = puVar10 != (ulong *)0x0;
    if (local_150.value != (ulong *)0x0 || puVar10 != (ulong *)0x0) {
      do {
        paVar2 = local_150.value;
        if ((bVar11) && (bVar12)) {
          uVar7 = (uint)local_150.key._0_4_ >> 0x18 | (local_150.key._0_4_ & 0xff0000) >> 8 |
                  (local_150.key._0_4_ & 0xff00) << 8 | local_150.key._0_4_ << 0x18;
          uVar8 = (uint)local_c0.key._0_4_ >> 0x18 | (local_c0.key._0_4_ & 0xff0000) >> 8 |
                  (local_c0.key._0_4_ & 0xff00) << 8 | local_c0.key._0_4_ << 0x18;
          if (uVar7 == uVar8) {
            uVar7 = (uint)(ushort)(local_150.key._4_2_ << 8 | (ushort)local_150.key._4_2_ >> 8);
            uVar8 = (uint)(ushort)(local_c0.key._4_2_ << 8 | (ushort)local_c0.key._4_2_ >> 8);
            uVar9 = 0;
            if (uVar7 != uVar8) goto LAB_001269f4;
          }
          else {
LAB_001269f4:
            uVar9 = -(uint)(uVar7 < uVar8) | 1;
          }
          if (uVar9 == 0) {
            pcVar5 = r1->containers[*local_150.value >> 8];
            type2 = (uint8_t)*puVar10;
            type1 = (uint8_t)*local_150.value;
            if (type1 == '\x04') {
              pcVar6 = container_or(pcVar5,'\x04',r2->containers[*puVar10 >> 8],type2,&local_151);
            }
            else {
              pcVar6 = container_ior(pcVar5,type1,r2->containers[*puVar10 >> 8],type2,&local_151);
            }
            if (pcVar6 != pcVar5) {
              container_free(pcVar5,type1);
              uVar4 = *paVar2;
              r1->containers[uVar4 >> 8] = pcVar6;
              *paVar2 = CONCAT71((int7)(uVar4 >> 8),local_151);
            }
            art_iterator_move(&local_150,true);
            iterator = &local_c0;
          }
          else {
            if ((bool)(bVar12 & -1 < (int)uVar9)) goto LAB_00126a30;
LAB_00126a1e:
            iterator = &local_150;
          }
LAB_00126b47:
          art_iterator_move(iterator,true);
        }
        else {
          if (!bVar11) {
            if (!bVar12) goto LAB_00126b51;
LAB_00126a30:
            uVar4 = *local_c0.value;
            c = (undefined8 *)r2->containers[uVar4 >> 8];
            if ((char)uVar4 == '\x04') {
              uVar4 = (ulong)*(byte *)(c + 1);
              c = (undefined8 *)*c;
            }
            pcVar5 = container_clone(c,(uint8_t)uVar4);
            val = add_container(r1,pcVar5,(uint8_t)uVar4);
            paVar3 = local_150.art;
            iterator = &local_c0;
            art_insert(local_150.art,iterator->key,val);
            local_150.depth = '\0';
            local_150.frame = '\0';
            art_node_iterator_lower_bound(((art_t *)&paVar3->root)->root,&local_150,iterator->key);
            goto LAB_00126b47;
          }
          if (!bVar12) goto LAB_00126a1e;
        }
LAB_00126b51:
        bVar11 = local_150.value != (ulong *)0x0;
        bVar12 = local_c0.value != (ulong *)0x0;
        puVar10 = local_c0.value;
      } while (bVar11 || bVar12);
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,
                                 const roaring64_bitmap_t *r2) {
    if (r1 == r2) {
        return;
    }
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> it1++
        // 2. !it1_present && it2_present  -> add it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> it1++
        //    b. it1 == it2 -> it1 | it2, it1++, it2++
        //    c. it1 >  it2 -> add it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;
                uint8_t typecode1 = get_typecode(*leaf1);
                container_t *container1 = get_container(r1, *leaf1);
                uint8_t typecode2;
                container_t *container2;
                if (get_typecode(*leaf1) == SHARED_CONTAINER_TYPE) {
                    container2 = container_or(container1, typecode1,
                                              get_container(r2, leaf2),
                                              get_typecode(leaf2), &typecode2);
                } else {
                    container2 = container_ior(container1, typecode1,
                                               get_container(r2, leaf2),
                                               get_typecode(leaf2), &typecode2);
                }
                if (container2 != container1) {
                    container_free(container1, typecode1);
                    replace_container(r1, leaf1, container2, typecode2);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t result_leaf =
                copy_leaf_container(r2, r1, (leaf_t)*it2.value);
            art_iterator_insert(&it1, it2.key, (art_val_t)result_leaf);
            art_iterator_next(&it2);
        }
    }
}